

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_StringUtilities.h
# Opt level: O0

string * __thiscall
choc::text::replace<std::__cxx11::string,char_const(&)[2],char_const(&)[2]>
          (string *__return_storage_ptr__,text *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *textToSearch,
          string_view firstToReplace,string_view firstReplacement,
          char (*otherPairsOfStringsToReplace) [2],char (*otherPairsOfStringsToReplace_1) [2])

{
  string_view firstReplacement_00;
  string_view firstReplacement_01;
  string_view firstToReplace_00;
  string_view firstToReplace_01;
  size_t in_stack_ffffffffffffff18;
  string *__return_storage_ptr___00;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  size_t sStack_90;
  char *local_88;
  size_t sStack_80;
  string local_78 [32];
  string local_58;
  text *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *textToSearch_local;
  string_view firstReplacement_local;
  string_view firstToReplace_local;
  
  textToSearch_local =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)firstToReplace._M_str;
  firstToReplace_00._M_len = firstToReplace._M_len;
  __return_storage_ptr___00 = __return_storage_ptr__;
  local_38 = this;
  firstReplacement_local._M_len = (size_t)otherPairsOfStringsToReplace;
  firstReplacement_local._M_str = (char *)textToSearch;
  std::__cxx11::string::string(local_78,(string *)this);
  local_88 = firstReplacement_local._M_str;
  local_98 = textToSearch_local;
  sStack_90 = firstReplacement_local._M_len;
  firstReplacement_00._M_str = (char *)__return_storage_ptr___00;
  firstReplacement_00._M_len = in_stack_ffffffffffffff18;
  firstToReplace_00._M_str = (char *)textToSearch_local;
  sStack_80 = firstToReplace_00._M_len;
  replace<std::__cxx11::string>
            (&local_58,(text *)local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             firstReplacement_local._M_str,firstToReplace_00,firstReplacement_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_b8,(char *)firstReplacement._M_len);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c8,firstReplacement._M_str);
  firstReplacement_01._M_str = (char *)__return_storage_ptr___00;
  firstReplacement_01._M_len = in_stack_ffffffffffffff18;
  firstToReplace_01._M_str = (char *)local_c8._M_len;
  firstToReplace_01._M_len = (size_t)local_b8[0]._M_str;
  replace<std::__cxx11::string>
            (__return_storage_ptr___00,(text *)&local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8[0]._M_len
             ,firstToReplace_01,firstReplacement_01);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string(local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string replace (StringType textToSearch, std::string_view firstToReplace, std::string_view firstReplacement,
                     OtherReplacements&&... otherPairsOfStringsToReplace)
{
    static_assert ((sizeof... (otherPairsOfStringsToReplace) & 1u) == 0,
                   "This function expects a list of pairs of strings as its arguments");

    if constexpr (std::is_same<const StringType, const std::string_view>::value || std::is_same<const StringType, const char* const>::value)
    {
        return replace (std::string (textToSearch), firstToReplace, firstReplacement,
                        std::forward<OtherReplacements> (otherPairsOfStringsToReplace)...);
    }
    else if constexpr (sizeof... (otherPairsOfStringsToReplace) == 0)
    {
        size_t pos = 0;

        for (;;)
        {
            pos = textToSearch.find (firstToReplace, pos);

            if (pos == std::string::npos)
                return textToSearch;

            textToSearch.replace (pos, firstToReplace.length(), firstReplacement);
            pos += firstReplacement.length();
        }
    }
    else
    {
        return replace (replace (std::move (textToSearch), firstToReplace, firstReplacement),
                        std::forward<OtherReplacements> (otherPairsOfStringsToReplace)...);
    }
}